

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall IRBuilder::EmitClosureRangeChecks(IRBuilder *this)

{
  SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  Type pJVar2;
  JitArenaAllocator *pJVar3;
  code *pcVar4;
  IRBuilder *pIVar5;
  bool bVar6;
  BOOL BVar7;
  uint uVar8;
  undefined4 *puVar9;
  Type *pTVar10;
  StackSym *pSVar11;
  Opnd *this_00;
  RegOpnd *pRVar12;
  Instr *pIVar13;
  AddrOpnd *newSrc;
  JITTimeFunctionBody *this_01;
  Instr *pIVar14;
  ByteCodeUsesInstr *this_02;
  ulong uVar15;
  FrameDisplayCheckTable *pFVar16;
  Func *pFVar17;
  Instr **ppIVar18;
  Iterator local_50;
  Instr *local_40;
  IRBuilder *local_38;
  
  pFVar17 = this->m_func;
  pFVar16 = pFVar17->frameDisplayCheckTable;
  local_38 = this;
  if (pFVar16 != (FrameDisplayCheckTable *)0x0) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    for (uVar15 = 0; uVar15 < pFVar16->tableSize; uVar15 = uVar15 + 1) {
      local_50.list = pFVar16->table + uVar15;
      local_50.current = &(local_50.list)->super_SListNodeBase<Memory::ArenaAllocator>;
      while( true ) {
        if ((SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)
            local_50.current ==
            (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)0x0)
        {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar6) goto LAB_0048fd0f;
          *puVar9 = 0;
        }
        pSVar1 = (SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount> *)
                 ((SListNodeBase<Memory::ArenaAllocator> *)&(local_50.current)->next)->next;
        if (pSVar1 == local_50.list) break;
        local_50.current = (NodeBase *)pSVar1;
        pTVar10 = SListBase<Bucket<FrameDisplayCheckRecord_*>,_Memory::ArenaAllocator,_RealCount>::
                  Iterator::Data(&local_50);
        pSVar11 = SymTable::FindStackSym(local_38->m_func->m_symTable,pTVar10->value);
        if ((pSVar11 == (StackSym *)0x0) ||
           (pIVar14 = (pSVar11->field_5).m_instrDef, pIVar14 == (Instr *)0x0)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,899,"(stackSym && stackSym->m_instrDef)",
                             "stackSym && stackSym->m_instrDef");
          if (!bVar6) goto LAB_0048fd0f;
          *puVar9 = 0;
          pIVar14 = (pSVar11->field_5).m_instrDef;
        }
        local_40 = pIVar14->m_next;
        this_00 = IR::Instr::UnlinkDst(pIVar14);
        pRVar12 = IR::Opnd::AsRegOpnd(this_00);
        pIVar5 = local_38;
        pIVar13 = IR::Instr::New(FrameDisplayCheck,&pRVar12->super_Opnd,local_38->m_func);
        pRVar12 = IR::RegOpnd::New(TyVar,pIVar5->m_func);
        IR::Instr::SetDst(pIVar14,&pRVar12->super_Opnd);
        IR::Instr::SetSrc1(pIVar13,&pRVar12->super_Opnd);
        newSrc = IR::AddrOpnd::New(pTVar10->element,AddrOpndKindDynamicMisc,pIVar5->m_func,true,
                                   (Var)0x0);
        IR::Instr::SetSrc2(pIVar13,&newSrc->super_Opnd);
        IR::Instr::InsertBefore(local_40,pIVar13);
      }
      pFVar17 = local_38->m_func;
      pFVar16 = pFVar17->frameDisplayCheckTable;
    }
  }
  bVar6 = Func::IsLoopBody(pFVar17);
  if ((!bVar6) && (BVar7 = Func::HasTry(local_38->m_func), BVar7 != 0)) {
    this_01 = Func::GetJITFunctionBody(local_38->m_func);
    uVar8 = JITTimeFunctionBody::GetByteCodeInLoopCount(this_01);
    if (uVar8 != 0) {
      pFVar17 = local_38->m_func;
      if ((pFVar17->m_localClosureSym == (StackSym *)0x0) ||
         ((pFVar17->m_localClosureSym->field_0x19 & 0x20) == 0)) {
        pIVar14 = (Instr *)0x0;
      }
      else {
        pIVar14 = (Instr *)new<Memory::JitArenaAllocator>(0x20,pFVar17->m_alloc,0x3d6ef4);
        pIVar5 = local_38;
        pJVar2 = local_38->m_func->m_alloc;
        pIVar14->_vptr_Instr = (_func_int **)0x0;
        *(Type_conflict *)&pIVar14->m_noLazyHelperAssert = (Type_conflict)0x0;
        pIVar14->m_next = (Instr *)pJVar2;
        pIVar14->m_prev = pIVar14;
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)pIVar14,
                   (local_38->m_func->m_localClosureSym->super_Sym).m_id);
        pFVar17 = pIVar5->m_func;
      }
      pSVar11 = pFVar17->m_localFrameDisplaySym;
      if ((pSVar11 == (StackSym *)0x0) || ((pSVar11->field_0x19 & 0x20) == 0)) {
        local_40 = pIVar14;
        if (pIVar14 == (Instr *)0x0) {
          return;
        }
      }
      else {
        if (pIVar14 == (Instr *)0x0) {
          pIVar14 = (Instr *)new<Memory::JitArenaAllocator>(0x20,pFVar17->m_alloc,0x3d6ef4);
          pJVar3 = local_38->m_func->m_alloc;
          pIVar14->_vptr_Instr = (_func_int **)0x0;
          *(Type_conflict *)&pIVar14->m_noLazyHelperAssert = (Type_conflict)0x0;
          pIVar14->m_next = (Instr *)pJVar3;
          pIVar14->m_prev = pIVar14;
          pSVar11 = local_38->m_func->m_localFrameDisplaySym;
        }
        local_40 = pIVar14;
        BVSparse<Memory::JitArenaAllocator>::Set
                  ((BVSparse<Memory::JitArenaAllocator> *)pIVar14,(pSVar11->super_Sym).m_id);
        pFVar17 = local_38->m_func;
      }
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      ppIVar18 = &pFVar17->m_tailInstr;
      pIVar14 = (Instr *)0x0;
      while (pIVar13 = *ppIVar18, pIVar13 != (Instr *)0x0) {
        if ((pIVar14 != (Instr *)0x0) && (pIVar14->m_prev != pIVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                             ,0x3ab,
                             "(__nextInstrCheck == nullptr || __nextInstrCheck->m_prev == instr)",
                             "Modifying instr list but not using EDITING iterator!");
          if (!bVar6) {
LAB_0048fd0f:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar9 = 0;
        }
        if (pIVar13->m_opcode == Ret) {
          this_02 = IR::ByteCodeUsesInstr::New(pIVar13);
          IR::ByteCodeUsesInstr::SetBV(this_02,(BVSparse<Memory::JitArenaAllocator> *)local_40);
          IR::Instr::InsertBefore(pIVar13,&this_02->super_Instr);
          return;
        }
        pIVar14 = pIVar13;
        ppIVar18 = &pIVar13->m_prev;
      }
    }
  }
  return;
}

Assistant:

void
IRBuilder::EmitClosureRangeChecks()
{
    if (m_func->frameDisplayCheckTable)
    {
        // Frame display checks. Again, chain to the instruction (LdEnv/LdSlot).
        FOREACH_HASHTABLE_ENTRY(FrameDisplayCheckRecord*, bucket, m_func->frameDisplayCheckTable)
        {
            StackSym *stackSym = m_func->m_symTable->FindStackSym(bucket.value);
            Assert(stackSym && stackSym->m_instrDef);

            IR::Instr *instrDef = stackSym->m_instrDef;
            IR::Instr *insertInstr = instrDef->m_next;
            IR::RegOpnd *dstOpnd = instrDef->UnlinkDst()->AsRegOpnd();
            IR::Instr *instr = IR::Instr::New(Js::OpCode::FrameDisplayCheck, dstOpnd, m_func);

            dstOpnd = IR::RegOpnd::New(TyVar, m_func);
            instrDef->SetDst(dstOpnd);
            instr->SetSrc1(dstOpnd);

            // Attach the two-dimensional check info.
            IR::AddrOpnd *recordOpnd = IR::AddrOpnd::New(bucket.element, IR::AddrOpndKindDynamicMisc, m_func, true);
            instr->SetSrc2(recordOpnd);

            insertInstr->InsertBefore(instr);
        }
        NEXT_HASHTABLE_ENTRY;
    }

    // If not a loop, but there are loops and trys, restore scope slot pointer and FD
    if (!m_func->IsLoopBody() && m_func->HasTry() && m_func->GetJITFunctionBody()->GetByteCodeInLoopCount() != 0)
    {
        BVSparse<JitArenaAllocator> * bv = nullptr;
        if (m_func->GetLocalClosureSym() && m_func->GetLocalClosureSym()->HasByteCodeRegSlot())
        {
            bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            bv->Set(m_func->GetLocalClosureSym()->m_id);
        }
        if (m_func->GetLocalFrameDisplaySym() && m_func->GetLocalFrameDisplaySym()->HasByteCodeRegSlot())
        {
            if (!bv)
            {
                bv = JitAnew(m_func->m_alloc, BVSparse<JitArenaAllocator>, m_func->m_alloc);
            }
            bv->Set(m_func->GetLocalFrameDisplaySym()->m_id);
        }
        if (bv)
        {

            FOREACH_INSTR_IN_FUNC_BACKWARD(instr, m_func)
            {
                if (instr->m_opcode == Js::OpCode::Ret)
                {
                    IR::ByteCodeUsesInstr * byteCodeUse = IR::ByteCodeUsesInstr::New(instr);
                    byteCodeUse->SetBV(bv);
                    instr->InsertBefore(byteCodeUse);
                    break;
                }
            }
            NEXT_INSTR_IN_FUNC_BACKWARD;
        }
    }
}